

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

MethodHandle * __thiscall
jsonrpccxx::methodHandle<unsigned_int,unsigned_int,unsigned_int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<unsigned_int_(unsigned_int,_unsigned_int)> *method)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::function
            ((function<unsigned_int_(unsigned_int,_unsigned_int)> *)&local_30,
             (function<unsigned_int_(unsigned_int,_unsigned_int)> *)this);
  createMethodHandle<unsigned_int,unsigned_int,unsigned_int,0ul,1ul>
            (__return_storage_ptr__,(jsonrpccxx *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }